

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O2

void matras_destroy_read_view(matras *m,matras_view *v)

{
  uint uVar1;
  matras_id_t mVar2;
  matras_id_t mVar3;
  matras_view *pmVar4;
  matras_view *pmVar5;
  void *ext;
  void *pvVar6;
  void *ext_00;
  void *ext_01;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  void *local_68;
  void *local_60;
  void *local_48;
  
  if ((matras *)v == m) {
    __assert_fail("v != &m->head",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                  ,0x18b,"void matras_destroy_read_view(struct matras *, struct matras_view *)");
  }
  pmVar4 = v->next_view;
  if (pmVar4 != (matras_view *)0x0) {
    pmVar5 = v->prev_view;
    pmVar4->prev_view = pmVar5;
    if (pmVar5 != (matras_view *)0x0) {
      pmVar5->next_view = pmVar4;
    }
    v->next_view = (matras_view *)0x0;
    uVar7 = v->block_count;
    if (uVar7 != 0) {
      ext = v->root;
      pvVar6 = pmVar4->root;
      if ((ext != pvVar6) || (pmVar4->block_count == 0)) {
        uVar8 = 0;
        if (pmVar5 == (matras_view *)0x0) {
          local_60 = (void *)0x0;
        }
        else {
          local_60 = pmVar5->root;
          if ((ext == local_60) && (pmVar5->block_count != 0)) {
            return;
          }
        }
        uVar1 = m->extent_size;
        mVar2 = m->mask1;
        mVar3 = m->mask2;
        uVar9 = 0;
        do {
          if (uVar7 <= uVar8) {
            matras_free_read_view_extent(m,ext);
            return;
          }
          ext_00 = *(void **)((long)ext + uVar9 * 8);
          if (uVar8 < pmVar4->block_count) {
            local_68 = *(void **)((long)pvVar6 + uVar9 * 8);
            if (ext_00 != local_68) goto LAB_00105b68;
          }
          else {
            local_68 = (void *)0x0;
LAB_00105b68:
            if ((pmVar5 == (matras_view *)0x0) || (pmVar5->block_count <= uVar8)) {
              local_48 = (void *)0x0;
            }
            else {
              local_48 = *(void **)((long)local_60 + uVar9 * 8);
              if (ext_00 == local_48) goto LAB_00105c10;
            }
            uVar10 = 0;
            for (uVar7 = uVar8; (uVar1 >> 3 != uVar10 && (uVar7 < v->block_count));
                uVar7 = (ulong)((int)uVar7 + mVar3 + 1)) {
              ext_01 = *(void **)((long)ext_00 + uVar10 * 8);
              if (((pmVar4->block_count <= uVar7) ||
                  (ext_01 != *(void **)((long)local_68 + uVar10 * 8))) &&
                 (((pmVar5 == (matras_view *)0x0 || (pmVar5->block_count <= uVar7)) ||
                  (ext_01 != *(void **)((long)local_48 + uVar10 * 8))))) {
                matras_free_read_view_extent(m,ext_01);
              }
              uVar10 = uVar10 + 1;
            }
            matras_free_read_view_extent(m,ext_00);
            uVar7 = v->block_count;
          }
LAB_00105c10:
          uVar9 = (ulong)((int)uVar9 + 1);
          uVar8 = (ulong)((int)uVar8 + mVar2 + 1);
        } while( true );
      }
    }
  }
  return;
}

Assistant:

void
matras_destroy_read_view(struct matras *m, struct matras_view *v)
{
	assert(v != &m->head);
	if (!v->next_view)
		return;
	struct matras_view *next_view = v->next_view;
	struct matras_view *prev_view = v->prev_view;
	next_view->prev_view = prev_view;
	if (prev_view)
		prev_view->next_view = next_view;
	v->next_view = 0;

	if (v->block_count == 0)
		return;
	if (v->root == next_view->root && next_view->block_count)
		return;
	if (prev_view && v->root == prev_view->root && prev_view->block_count)
		return;
	void **extent1 = (void **)v->root;
	void **extent1n = (void **) next_view->root;
	void **extent1p = 0;
	if (prev_view)
		extent1p = (void **) prev_view->root;
	matras_id_t step1 = m->mask1 + 1;
	matras_id_t step2 = m->mask2 + 1;
	matras_id_t i1 = 0, j1 = 0, i2, j2;
	matras_id_t ptrs_in_ext = m->extent_size / (matras_id_t)sizeof(void *);
	for (; j1 < v->block_count; i1++, j1 += step1) {
		void **extent2 = (void **)extent1[i1];
		void **extent2n = 0;
		void **extent2p = 0;
		if (next_view->block_count > j1) {
			if (extent1[i1] == extent1n[i1])
				continue;
			extent2n = (void **) extent1n[i1];
		}
		if (prev_view && prev_view->block_count > j1) {
			if (extent1[i1] == extent1p[i1])
				continue;
			extent2p = (void **) extent1p[i1];
		}
		for (i2 = j2 = 0;
		     i2 < ptrs_in_ext && j1 + j2 < v->block_count;
		     i2++, j2 += step2) {
			void **extent3 = (void **)extent2[i2];
			if (next_view->block_count > j1 + j2) {
				if (extent2[i2] == extent2n[i2])
					continue;
			}
			if (prev_view && prev_view->block_count > j1 + j2) {
				if (extent2[i2] == extent2p[i2])
					continue;
			}
			matras_free_read_view_extent(m, extent3);
		}
		matras_free_read_view_extent(m, extent2);
	}
	matras_free_read_view_extent(m, extent1);
}